

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

void __thiscall arm::ConstValue::display(ConstValue *this,ostream *o)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  
  cVar1 = this->field_0x28;
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(o,"\t.word ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)o);
    return;
  }
  if (cVar1 != '\x01') {
    if (cVar1 != '\x02') {
      return;
    }
    if (this->ty == Word) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"\t.word ",7);
      pcVar9 = *(char **)&this->field_0x8;
      lVar6 = *(long *)&this->field_0x10;
    }
    else {
      if (this->ty != AsciZ) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,"\t.asciz \"",9);
      o = std::__ostream_insert<char,std::char_traits<char>>
                    (o,*(char **)&this->field_0x8,*(long *)&this->field_0x10);
      pcVar9 = "\"";
      lVar6 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,pcVar9,lVar6);
    return;
  }
  piVar5 = *(int **)&this->field_0x8;
  if (4 < (ulong)(*(long *)&this->field_0x10 - (long)piVar5)) {
    bVar3 = true;
    iVar8 = 1;
    uVar7 = 1;
    iVar10 = *piVar5;
    do {
      iVar2 = piVar5[uVar7];
      cVar1 = (char)o;
      if (bVar3) {
        if (iVar2 == iVar10) {
LAB_001b349e:
          iVar8 = iVar8 + 1;
        }
        else {
          std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar1);
          std::ostream::put(cVar1);
          poVar4 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t.word ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        }
        bVar3 = false;
      }
      else {
        if (iVar2 == iVar10) goto LAB_001b349e;
        bVar3 = 1 < iVar8;
        if (bVar3) {
          std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar1);
          std::ostream::put(cVar1);
          poVar4 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t.fill ",7);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", 4, ",5);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          iVar8 = 1;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)o);
        }
      }
      uVar7 = uVar7 + 1;
      piVar5 = *(int **)&this->field_0x8;
      iVar10 = iVar2;
    } while (uVar7 < (ulong)(*(long *)&this->field_0x10 - (long)piVar5 >> 2));
    if (1 < iVar8) {
      std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(o,"\t.fill ",7);
      poVar4 = (ostream *)std::ostream::operator<<(o,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", 4, ",5);
      goto LAB_001b367c;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
  poVar4 = o;
LAB_001b367c:
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (((this->len).super__Optional_base<int,_true,_true>._M_payload.
       super__Optional_payload_base<int>._M_engaged == true) &&
     ((ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 2) <
      (ulong)(long)(this->len).super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_payload._M_value)) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"\t.fill ",7);
    if ((this->len).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)o);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", 4, ",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void ConstValue::display(std::ostream &o) const {
  if (auto x = std::get_if<uint32_t>(this)) {
    o << "\t.word " << *x;
  } else if (auto x = std::get_if<std::vector<uint32_t>>(this)) {
    uint32_t last = x->front();
    int repeat_count = 1;
    bool newline = true;
    for (int i = 1; i < x->size(); i++) {
      uint32_t new_item = (*x)[i];
      if (newline) {
        if (new_item == last) {
          repeat_count++;
        } else {
          o << std::endl << "\t.word " << last;
        }
        newline = false;
      } else {
        if (new_item == last) {
          repeat_count++;
        } else {
          if (repeat_count > 1) {
            o << std::endl << "\t.fill " << repeat_count << ", 4, " << last;
            newline = true;
            repeat_count = 1;
          } else {
            o << ", " << last;
          }
        }
      }
      last = new_item;
    }
    if (repeat_count > 1) {
      o << std::endl;
      o << "\t.fill " << repeat_count << ", 4, " << last << std::endl;
      newline = true;
      repeat_count = 1;
    } else {
      o << ", " << last << std::endl;
    }
    if (len && x->size() < len.value()) {
      o << "\t.fill " << (len.value() - x->size()) << ", 4, " << last
        << std::endl;
    }
  } else if (auto x = std::get_if<std::string>(this)) {
    if (ty == ConstType::AsciZ)
      o << "\t.asciz \"" << *x << "\"";
    else if (ty == ConstType::Word)
      o << "\t.word " << *x;
  }
}